

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createStore(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Value *val;
  long *plVar1;
  undefined8 *puVar2;
  Instruction *pIVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar8;
  PSNode *op2;
  PSNode *local_38;
  PSNode *local_30;
  PSNode *local_28;
  Instruction *local_20;
  
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar3 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar3 = *(Instruction **)(Inst + -8);
  }
  val = *(Value **)pIVar3;
  if (val[0x10] == (Value)0x40) {
    uVar5 = (ulong)val % *(ulong *)(this + 400);
    plVar6 = *(long **)(*(long *)(this + 0x188) + uVar5 * 8);
    plVar7 = (long *)0x0;
    if ((plVar6 != (long *)0x0) &&
       (plVar1 = (long *)*plVar6, plVar7 = plVar6, val != (Value *)((long *)*plVar6)[1])) {
      while (plVar6 = plVar1, plVar1 = (long *)*plVar6, plVar1 != (long *)0x0) {
        plVar7 = (long *)0x0;
        if (((ulong)plVar1[1] % *(ulong *)(this + 400) != uVar5) ||
           (plVar7 = plVar6, val == (Value *)plVar1[1])) goto LAB_0011ebcc;
      }
      plVar7 = (long *)0x0;
    }
LAB_0011ebcc:
    if (plVar7 == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *plVar7;
    }
    if (lVar4 == 0) {
      puVar2 = &UNKNOWN_MEMORY;
    }
    else {
      puVar2 = *(undefined8 **)(lVar4 + 0x10);
    }
    local_38 = (PSNode *)*puVar2;
  }
  else {
    local_38 = getOperand(this,val);
  }
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    lVar4 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    lVar4 = *(long *)(Inst + -8);
  }
  local_30 = getOperand(this,*(Value **)(lVar4 + 0x20));
  local_28 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                       ((PointerGraph *)this,&local_38,&local_30);
  local_20 = Inst;
  pVar8 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::PSNode*&>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_20,&local_28);
  (local_28->super_SubgraphNode<dg::pta::PSNode>).user_data = local_20;
  return (PSNodesSeq *)
         ((long)pVar8.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createStore(const llvm::Instruction *Inst) {
    using namespace llvm;
    const Value *valOp = Inst->getOperand(0);

    PSNode *op1;
    if (isa<AtomicRMWInst>(valOp)) {
        // we store the old value of AtomicRMW
        auto it = nodes_map.find(valOp);
        if (it == nodes_map.end()) {
            op1 = UNKNOWN_MEMORY;
        } else {
            op1 = it->second.getFirst();
            assert(op1->getType() == PSNodeType::LOAD &&
                   "Invalid AtomicRMW nodes seq");
        }
    } else {
        op1 = getOperand(valOp);
    }

    PSNode *op2 = getOperand(Inst->getOperand(1));
    PSNode *node = PS.create<PSNodeType::STORE>(op1, op2);

    assert(node);
    return addNode(Inst, node);
}